

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

void Js::JavascriptObject::CopyDataPropertiesHelper<true,true>
               (Var source,RecyclableObject *to,ScriptContext *scriptContext,
               BVSparse<Memory::Recycler> *excluded)

{
  code *pcVar1;
  BVSparse<Memory::Recycler> *scriptContext_00;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  PCWSTR varName;
  DynamicObject *from_00;
  DynamicObject *this;
  DynamicType *pDVar5;
  JavascriptLibrary *this_00;
  DynamicType *pDVar6;
  DynamicObject *toObj;
  DynamicObject *fromObj;
  RecyclableObject *pRStack_30;
  bool copied;
  RecyclableObject *from;
  BVSparse<Memory::Recycler> *excluded_local;
  ScriptContext *scriptContext_local;
  RecyclableObject *to_local;
  Var source_local;
  
  from = (RecyclableObject *)excluded;
  excluded_local = (BVSparse<Memory::Recycler> *)scriptContext;
  scriptContext_local = (ScriptContext *)to;
  to_local = (RecyclableObject *)source;
  BVar3 = Js::JavascriptOperators::IsObject(to);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x665,"(JavascriptOperators::IsObject(to))",
                                "JavascriptOperators::IsObject(to)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRStack_30 = (RecyclableObject *)0x0;
  BVar3 = JavascriptConversion::ToObject
                    (to_local,(ScriptContext *)excluded_local,&stack0xffffffffffffffd0);
  if (BVar3 == 0) {
    BVar3 = Js::JavascriptOperators::IsUndefinedOrNull(to_local);
    scriptContext_00 = excluded_local;
    if (BVar3 == 0) {
      varName = GetCopyDataPropertiesEntryName<true>();
      JavascriptError::ThrowTypeError((ScriptContext *)scriptContext_00,-0x7ff5ec36,varName);
    }
  }
  else {
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pRStack_30);
    bVar2 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(pRStack_30);
    if (bVar2) {
      CopyDataPropertiesForProxyObjects<true>
                (pRStack_30,(RecyclableObject *)scriptContext_local,
                 (BVSparse<Memory::Recycler> *)from,(ScriptContext *)excluded_local);
    }
    else {
      fromObj._7_1_ = false;
      from_00 = DynamicObject::TryVarToBaseDynamicObject(pRStack_30);
      this = DynamicObject::TryVarToBaseDynamicObject(scriptContext_local);
      if ((this != (DynamicObject *)0x0) && (from_00 != (DynamicObject *)0x0)) {
        pDVar5 = (DynamicType *)RecyclableObject::GetType(&this->super_RecyclableObject);
        this_00 = ScriptContext::GetLibrary((ScriptContext *)excluded_local);
        pDVar6 = JavascriptLibrary::GetObjectType(this_00);
        if (pDVar5 == pDVar6) {
          fromObj._7_1_ = DynamicObject::TryCopy(this,from_00);
        }
      }
      if (fromObj._7_1_ == false) {
        CopyDataPropertiesForGenericObjects<true>
                  (pRStack_30,(RecyclableObject *)scriptContext_local,
                   (BVSparse<Memory::Recycler> *)0x0,(ScriptContext *)excluded_local);
      }
    }
  }
  return;
}

Assistant:

void JavascriptObject::CopyDataPropertiesHelper(Var source, RecyclableObject* to, ScriptContext* scriptContext, const BVSparse<Recycler>* excluded)
{
    // If assign is false, this performs CopyDataProperties(https://tc39.github.io/ecma262/#sec-copydataproperties).
    //    Variable excluded is ignored.
    // Otherwise, it performs the loop body of step 4 in Object.assign (https://tc39.github.io/ecma262/#sec-object.assign).
    //    Value of tryCopy is ignored.
    // 1. Assert Type(to) is Object.
    // 2. Assert Type(excluded) is List.
    // 3. If source is undefined or null, let keys be a new empty List
    // 4. Else,
    //    a. Let from be ToObject(source).
    //    b. Let keys be from.[[OwnpropertyKeys]]().
    // 5. Repeat for each element nextKey of keys in List order,
    //    a. If we are not in assign mode, then
    //        i. Let found be false.
    //        ii. Repeat for each element e of excluded,
    //            1. If e is not empty and SameValue(e, nextKey) is true, then
    //                a. Set found to true.
    //    b. If found is false or we are in assign mode, then
    //        i. Let desc be from.[[GetOwnProperty]](nextKey).
    //        ii. If desc is not undefined and desc.[[Enumerable]] is true, then
    //            1. Let propValue be Get(from, nextKey).
    //            2. If we are in assign mode, then
    //                a. Perform Set(to, nextKey, propValue, true).
    //            3. Else,
    //                a. Perform CreateDataProperty(to, nextKey, propValue).
    // 6. Return target (target is returned in pointer).
    Assert(JavascriptOperators::IsObject(to));
    RecyclableObject* from = nullptr;
    if (!JavascriptConversion::ToObject(source, scriptContext, &from))
    {
        if (JavascriptOperators::IsUndefinedOrNull(source))
        {
            return;
        }
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, GetCopyDataPropertiesEntryName<assign>());
    }

#if ENABLE_COPYONACCESS_ARRAY
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(from);
#endif
    // if proxy, take slow path by calling [[OwnPropertyKeys]] on source
    if (VarIs<JavascriptProxy>(from))
    {
        CopyDataPropertiesForProxyObjects<assign>(from, to, excluded, scriptContext);
    }
    // else use enumerator to extract keys from source
    else
    {
        if (assign)
        {
            bool copied = false;
            if (tryCopy)
            {
                DynamicObject* fromObj = DynamicObject::TryVarToBaseDynamicObject(from);
                DynamicObject* toObj = DynamicObject::TryVarToBaseDynamicObject(to);
                if (toObj && fromObj && toObj->GetType() == scriptContext->GetLibrary()->GetObjectType())
                {
                    copied = toObj->TryCopy(fromObj);
                }
            }
            if (!copied)
            {
                CopyDataPropertiesForGenericObjects<assign>(from, to, /*excluded*/ nullptr, scriptContext);
            }
        }
        else
        {
            CopyDataPropertiesForGenericObjects<assign>(from, to, excluded, scriptContext);
        }
    }
}